

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

bool __thiscall DialogPrompt::update(DialogPrompt *this,TextEvent textEvent)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  vector<TextField,_std::allocator<TextField>_> *this_00;
  reference pvVar6;
  int __args;
  reference pTVar7;
  uint in_ESI;
  long in_RDI;
  TextField *f;
  iterator __end5;
  iterator __begin5;
  vector<TextField,_std::allocator<TextField>_> *__range5;
  uint i;
  vector<TextField,_std::allocator<TextField>_> *in_stack_ffffffffffffff98;
  function<void_(int)> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  __normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_> local_28;
  long local_20;
  uint local_14;
  uint local_4;
  
  if ((*(byte *)(in_RDI + 0xb1) & 1) != 0) {
    if (in_ESI == 9) {
      local_14 = 0;
      while( true ) {
        uVar3 = (ulong)local_14;
        sVar4 = std::vector<TextField,_std::allocator<TextField>_>::size
                          ((vector<TextField,_std::allocator<TextField>_> *)(in_RDI + 0x398));
        if (sVar4 <= uVar3) break;
        pvVar5 = std::vector<TextField,_std::allocator<TextField>_>::operator[]
                           ((vector<TextField,_std::allocator<TextField>_> *)(in_RDI + 0x398),
                            (ulong)local_14);
        if ((pvVar5->selected & 1U) == 1) {
          pvVar5 = std::vector<TextField,_std::allocator<TextField>_>::operator[]
                             ((vector<TextField,_std::allocator<TextField>_> *)(in_RDI + 0x398),
                              (ulong)local_14);
          pvVar5->selected = false;
          this_00 = (vector<TextField,_std::allocator<TextField>_> *)(in_RDI + 0x398);
          uVar2 = local_14 + 1;
          sVar4 = std::vector<TextField,_std::allocator<TextField>_>::size
                            ((vector<TextField,_std::allocator<TextField>_> *)(in_RDI + 0x398));
          pvVar5 = std::vector<TextField,_std::allocator<TextField>_>::operator[]
                             (this_00,(ulong)uVar2 % sVar4);
          pvVar5->selected = true;
          return false;
        }
        local_14 = local_14 + 1;
      }
    }
    else if (in_ESI == 0xd) {
      std::vector<TextButton,_std::allocator<TextButton>_>::operator[]
                ((vector<TextButton,_std::allocator<TextButton>_> *)(in_RDI + 0x380),0);
      bVar1 = std::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (bVar1) {
        pvVar6 = std::vector<TextButton,_std::allocator<TextButton>_>::operator[]
                           ((vector<TextButton,_std::allocator<TextButton>_> *)(in_RDI + 0x380),0);
        __args = (int)((ulong)&pvVar6->action >> 0x20);
        std::vector<TextButton,_std::allocator<TextButton>_>::operator[]
                  ((vector<TextButton,_std::allocator<TextButton>_> *)(in_RDI + 0x380),0);
        std::function<void_(int)>::operator()(in_stack_ffffffffffffffa0,__args);
      }
    }
    else if (in_ESI == 0x1b) {
      UserInterface::closeAllDialogPrompts((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    }
    else {
      local_20 = in_RDI + 0x398;
      local_4 = in_ESI;
      local_28._M_current =
           (TextField *)
           std::vector<TextField,_std::allocator<TextField>_>::begin(in_stack_ffffffffffffff98);
      std::vector<TextField,_std::allocator<TextField>_>::end(in_stack_ffffffffffffff98);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>
                                 *)in_stack_ffffffffffffffa0,
                                (__normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>
                                 *)in_stack_ffffffffffffff98), bVar1) {
        pTVar7 = __gnu_cxx::
                 __normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>
                 ::operator*(&local_28);
        (*(pTVar7->super_UIComponent).super_Drawable._vptr_Drawable[4])(pTVar7,(ulong)local_4);
        __gnu_cxx::
        __normal_iterator<TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>::
        operator++(&local_28);
      }
    }
  }
  return false;
}

Assistant:

bool DialogPrompt::update(Event::TextEvent textEvent) {
    if (visible) {
        if (textEvent.unicode == 9) {    // If key tab pressed, attempt to switch to next text field.
            for (unsigned int i = 0; i < optionFields.size(); ++i) {
                if (optionFields[i].selected == true) {
                    optionFields[i].selected = false;
                    optionFields[(i + 1) % optionFields.size()].selected = true;
                    break;
                }
            }
        } else if (textEvent.unicode == 13) {    // If key enter pressed, activate the first button (assumed as confirmation action).
            if (optionButtons[0].action != nullptr) {
                optionButtons[0].action(optionButtons[0].actionOption);
            }
        } else if (textEvent.unicode == 27) {    // Escape pressed, close dialog.
            UserInterface::closeAllDialogPrompts();
        } else {    // Else, send the text event to the fields.
            for (TextField& f : optionFields) {
                f.update(textEvent);
            }
        }
    }
    return false;
}